

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int clone_bbs(gen_ctx_t gen_ctx)

{
  char cVar1;
  uint uVar2;
  bitmap_t pVVar3;
  out_edge_t peVar4;
  undefined8 *puVar5;
  MIR_context_t pMVar6;
  MIR_label_t label;
  VARR_size_t *pVVar7;
  void *pvVar8;
  def_tab_el_t el;
  void *__ptr;
  int *piVar9;
  MIR_insn_t *ppMVar10;
  anon_union_8_10_166bea1d_for_u func;
  int *piVar11;
  uint uVar12;
  int extraout_EAX;
  ulong uVar13;
  bb_t_conflict *ppbVar14;
  VARR_bb_t *pVVar15;
  MIR_insn_t insn;
  MIR_insn_t_conflict pMVar16;
  gen_ctx *pgVar17;
  undefined1 *puVar18;
  MIR_item_t pMVar19;
  MIR_insn_t_conflict pMVar20;
  c2mir_ctx *pcVar21;
  VARR_bb_t *pVVar22;
  bb_insn_t_conflict pbVar23;
  bb_insn_t_conflict pbVar24;
  bb_insn_t_conflict *ppbVar25;
  bb_t_conflict pbVar26;
  func_cfg_t pfVar27;
  VARR_bb_insn_t *pVVar28;
  func_cfg_t extraout_RAX;
  ulong extraout_RAX_00;
  bb_insn_t pbVar29;
  func_cfg_t extraout_RAX_01;
  bool bVar30;
  int *piVar31;
  bb_insn_t pbVar32;
  ssa_ctx *psVar33;
  gen_ctx *pgVar34;
  ulong uVar35;
  ulong *extraout_RDX;
  gen_ctx_t pgVar36;
  gen_ctx_t pgVar37;
  ulong uVar38;
  gen_ctx_t gen_ctx_00;
  gen_ctx *insn_00;
  char *pcVar39;
  long lVar40;
  ulong uVar41;
  MIR_module *pMVar42;
  bb_t pbVar43;
  size_t sVar44;
  gen_ctx *bb;
  int iVar45;
  gen_ctx *pgVar46;
  char *pcVar47;
  bb_t pbVar48;
  gen_ctx *pgVar49;
  bitmap_t *ppVVar50;
  long lVar51;
  MIR_op_t *pMVar52;
  bb_t_conflict pbVar53;
  size_t sVar54;
  gen_ctx *pgVar55;
  DLIST_in_edge_t *pDVar56;
  bool bVar57;
  int iStackY_27c;
  ulong uStackY_278;
  MIR_op_t *pMStackY_270;
  bb_t_conflict pbStackY_268;
  bb_insn_t pbStackY_260;
  long lStackY_258;
  undefined1 *puStackY_250;
  gen_ctx *pgStackY_240;
  ulong uStackY_238;
  gen_ctx_t pgStackY_230;
  char *pcStackY_228;
  gen_ctx *pgStackY_220;
  gen_ctx_t pgStackY_218;
  gen_ctx *pgStackY_210;
  gen_ctx *pgStackY_208;
  gen_ctx *pgStackY_200;
  gen_ctx *pgStackY_1f8;
  bb_insn_t pbStack_1c8;
  int iStack_1ac;
  long lStack_1a8;
  def_tab_el_t dStack_1a0;
  int *piStack_188;
  int iStack_180;
  int iStack_17c;
  bb_insn_t pbStack_178;
  DLIST_LINK_bb_t *pDStack_170;
  ulong uStack_168;
  bb_t_conflict pbStack_160;
  gen_ctx *pgStack_158;
  gen_ctx *pgStack_150;
  gen_ctx *pgStack_148;
  gen_ctx *pgStack_140;
  gen_ctx_t pgStack_138;
  gen_ctx *pgStack_130;
  gen_ctx *pgStack_128;
  gen_ctx *pgStack_120;
  gen_ctx *pgStack_118;
  gen_ctx *pgStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  gen_ctx_t local_d8;
  MIR_insn_t local_d0;
  gen_ctx *local_c8;
  MIR_label_t local_c0;
  gen_ctx_t local_b8;
  anon_union_8_10_166bea1d_for_u local_b0;
  gen_ctx *local_a8;
  ulong local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (gen_ctx->optimize_level != 0) {
    pVVar3 = gen_ctx->temp_bitmap;
    if ((pVVar3 != (bitmap_t)0x0) && (pVVar3->varr != (bitmap_el_t *)0x0)) {
      local_c8 = (gen_ctx *)gen_ctx->ctx;
      local_b0 = gen_ctx->curr_func_item->u;
      pVVar3->els_num = 0;
      pbVar26 = (gen_ctx->curr_cfg->bbs).head;
      local_d8 = gen_ctx;
      while( true ) {
        if (pbVar26 == (bb_t_conflict)0x0) {
          return 0;
        }
        pVVar3 = local_d8->temp_bitmap;
        uVar13 = pbVar26->index;
        pgStack_110 = (gen_ctx *)0x154ece;
        bitmap_expand(pVVar3,uVar13 + 1);
        pgVar37 = local_d8;
        if (pVVar3 == (bitmap_t)0x0) {
          pgStack_110 = (gen_ctx *)0x1556d5;
          clone_bbs_cold_14();
          goto LAB_001556d5;
        }
        pVVar3->varr[uVar13 >> 6] = pVVar3->varr[uVar13 >> 6] | 1L << (uVar13 & 0x3f);
        pbVar29 = (pbVar26->bb_insns).tail;
        if ((pbVar29 != (bb_insn_t)0x0) && (*(int *)&pbVar29->insn->field_0x18 - 0xabU < 2)) break;
        pbVar26 = (pbVar26->bb_link).next;
      }
      pVVar22 = local_d8->data_flow_ctx->worklist;
      if ((pVVar22 == (VARR_bb_t *)0x0) || (pVVar22->varr == (bb_t_conflict *)0x0)) {
        pgStack_110 = (gen_ctx *)0x15576f;
        clone_bbs_cold_13();
LAB_0015576f:
        pgStack_110 = (gen_ctx *)0x155774;
        clone_bbs_cold_1();
      }
      else {
        pVVar22->els_num = 0;
        for (pbVar48 = (pbVar26->bb_link).next; pbVar48 != (bb_t)0x0;
            pbVar48 = (pbVar48->bb_link).next) {
          pbVar29 = (pbVar48->bb_insns).tail;
          if (pbVar29 == (bb_insn_t)0x0) {
            pgStack_110 = (gen_ctx *)0x15573c;
            __assert_fail("bb_insn != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x7de,"int clone_bbs(gen_ctx_t)");
          }
          if ((*(int *)&pbVar29->insn->field_0x18 == 0x76) &&
             (peVar4 = (pbVar48->out_edges).head, peVar4 != (out_edge_t)0x0)) {
            pVVar3 = pgVar37->temp_bitmap;
            if (pVVar3 == (bitmap_t)0x0) goto LAB_00155746;
            uVar13 = peVar4->dst->index;
            if ((uVar13 < pVVar3->els_num << 6) &&
               ((pVVar3->varr[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)) {
              pVVar22 = pgVar37->data_flow_ctx->worklist;
              if (pVVar22->varr == (bb_t_conflict *)0x0) goto LAB_0015576f;
              uVar13 = pVVar22->els_num + 1;
              if (pVVar22->size < uVar13) {
                sVar54 = (uVar13 >> 1) + uVar13;
                pgStack_110 = (gen_ctx *)0x154fde;
                ppbVar14 = (bb_t_conflict *)realloc(pVVar22->varr,sVar54 * 8);
                pVVar22->varr = ppbVar14;
                pVVar22->size = sVar54;
              }
              sVar54 = pVVar22->els_num;
              pVVar22->els_num = sVar54 + 1;
              pVVar22->varr[sVar54] = pbVar48;
            }
          }
        }
        pVVar22 = pgVar37->data_flow_ctx->worklist;
        if (pVVar22 != (VARR_bb_t *)0x0) {
          pVVar15 = pgVar37->data_flow_ctx->worklist;
          bVar57 = pVVar15 == (VARR_bb_t *)0x0;
          if (bVar57) {
LAB_001556d5:
            pgStack_110 = (gen_ctx *)0x1556da;
            clone_bbs_cold_11();
LAB_001556da:
            pgStack_110 = (gen_ctx *)0x1556df;
            clone_bbs_cold_9();
LAB_001556df:
            pgStack_110 = (gen_ctx *)0x1556fe;
            __assert_fail("(DLIST_out_edge_t_next (e)) == ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x7ed,"int clone_bbs(gen_ctx_t)");
          }
          bVar30 = true;
          iVar45 = 0;
          insn_00 = (gen_ctx *)0x0;
          uVar13 = pVVar22->els_num;
          pgVar46 = (gen_ctx *)0x0;
LAB_0015503f:
          pgVar37 = local_d8;
          sVar54 = pVVar15->els_num;
          do {
            sVar44 = sVar54 - 1;
            if (sVar54 == 0) {
              if (bVar30) {
                return iVar45;
              }
              pgStack_110 = (gen_ctx *)0x1556b3;
              remove_unreachable_bbs(local_d8);
              pgStack_110 = (gen_ctx *)0x1556bb;
              enumerate_bbs(pgVar37);
              return iVar45;
            }
            if (sVar54 < uVar13) {
              if (pVVar15->varr == (bb_t_conflict *)0x0) {
                pgStack_110 = (gen_ctx *)0x155741;
                clone_bbs_cold_10();
                goto LAB_00155741;
              }
              pbVar29 = (pVVar15->varr[sVar44]->bb_insns).head;
              insn_00 = (gen_ctx *)0x0;
              uVar13 = sVar54;
              if (pbVar29 == (bb_insn_t)0x0) {
                insn_00 = (gen_ctx *)0x0;
                pgVar46 = insn_00;
              }
              else {
                do {
                  insn_00 = (gen_ctx *)((long)&insn_00->ctx + 1);
                  pbVar29 = (pbVar29->bb_insn_link).next;
                  pgVar46 = insn_00;
                } while (pbVar29 != (bb_insn_t)0x0);
              }
            }
            if (pVVar15->varr == (bb_t_conflict *)0x0) goto LAB_001556da;
            pVVar15->els_num = sVar44;
            bb = (gen_ctx *)pVVar15->varr[sVar44];
            pgVar17 = (gen_ctx *)((DLIST_out_edge_t *)&bb->addr_regs)->head;
            if ((bb_t)pgVar17->to_free != (bb_t)0x0) goto LAB_001556df;
            if (*(char *)((long)&((DLIST_in_edge_t *)&pgVar17->addr_insn_p)->head + 1) == '\0') {
              pbVar29 = (bb_insn_t)bb->temp_bitmap2;
              if ((pbVar29 == (bb_insn_t)0x0) || (*(int *)&pbVar29->insn->field_0x18 != 0x76)) {
                pgStack_110 = (gen_ctx *)0x15571d;
                __assert_fail("bb_insn != ((void*)0) && bb_insn->insn->code == MIR_JMP",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x7f0,"int clone_bbs(gen_ctx_t)");
              }
              pcVar21 = *(c2mir_ctx **)&pgVar17->optimize_level;
              if ((2 < *(int *)(**(long **)(pcVar21 + 0x58) + 0x18) - 0xaaU) &&
                 (insn_00 <= (gen_ctx *)((long)pgVar46 * 3))) goto LAB_001550fa;
            }
            sVar54 = sVar44;
            if (bVar57) goto LAB_001556d5;
          } while( true );
        }
      }
      pgStack_110 = (gen_ctx *)0x155779;
      clone_bbs_cold_12();
LAB_00155779:
      pgStack_110 = (gen_ctx *)0x155798;
      __assert_fail("last_dst_insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x810,"int clone_bbs(gen_ctx_t)");
    }
LAB_00155741:
    pgStack_110 = (gen_ctx *)0x155746;
    clone_bbs_cold_15();
LAB_00155746:
    pgStack_110 = (gen_ctx *)0x15574b;
    clone_bbs_cold_2();
  }
  pgStack_110 = (gen_ctx *)0x15576a;
  __assert_fail("gen_ctx->optimize_level != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x7d3,"int clone_bbs(gen_ctx_t)");
LAB_001550fa:
  local_a8 = pgVar46;
  local_a0 = uVar13;
  if (((FILE *)local_d8->debug_file != (FILE *)0x0) && (1 < local_d8->debug_level)) {
    pgStack_110 = (gen_ctx *)0x15512e;
    fprintf((FILE *)local_d8->debug_file,"  Cloning from BB%lu into BB%lu:\n",*(undefined8 *)pcVar21
            ,(gen_ctx *)bb->ctx);
  }
  local_b8 = (gen_ctx_t)&bb->temp_bitmap;
  local_c0 = (MIR_label_t)**(undefined8 **)(pcVar21 + 0x58);
  insn = (pbVar29->insn->insn_link).prev;
  pgStack_110 = (gen_ctx *)0x155153;
  gen_delete_insn(pgVar37,pbVar29->insn);
  pgVar46 = local_c8;
  for (puVar5 = *(undefined8 **)(pcVar21 + 0x50); local_d0 = insn, local_c8 = pgVar46,
      puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)puVar5[5]) {
    if (*(int *)&((MIR_insn_t_conflict)*puVar5)->field_0x18 != 0xb4) {
      pgStack_110 = (gen_ctx *)0x155189;
      insn = MIR_copy_insn((MIR_context_t)pgVar46,(MIR_insn_t_conflict)*puVar5);
      pgVar37 = local_d8;
      pgStack_110 = (gen_ctx *)0x1551a5;
      MIR_insert_insn_after((MIR_context_t)pgVar46,local_d8->curr_func_item,local_d0,insn);
      pgStack_110 = (gen_ctx *)0x1551b3;
      pbVar24 = create_bb_insn(pgVar37,insn,(bb_t_conflict)bb);
      pgStack_110 = (gen_ctx *)0x1551c0;
      DLIST_bb_insn_t_append((DLIST_bb_insn_t *)local_b8,pbVar24);
      if (((FILE *)pgVar37->debug_file != (FILE *)0x0) && (1 < pgVar37->debug_level)) {
        pgStack_110 = (gen_ctx *)0x1551e4;
        fprintf((FILE *)pgVar37->debug_file,"  Adding insn %-5lu",
                (ulong)*(uint *)((long)insn->data + 0xc));
        pgStack_110 = (gen_ctx *)0x155200;
        MIR_output_insn((MIR_context_t)local_c8,pgVar37->debug_file,insn,local_b0.func,1);
      }
      insn_00 = (gen_ctx *)((long)&insn_00->ctx + 1);
    }
    pgVar46 = local_c8;
  }
  pgStack_110 = (gen_ctx *)0x155220;
  delete_edge((edge_t_conflict)pgVar17);
  pgVar55 = local_c8;
  pgVar46 = local_d8;
  if (local_c0 == (MIR_label_t)0x0) goto LAB_00155779;
  if (*(int *)&local_c0->field_0x18 - 0x77U < 0x2e) {
    pMVar20 = (local_c0->insn_link).next;
    if (*(int *)&pMVar20->field_0x18 != 0xb4) {
      pMVar6 = local_d8->ctx;
      pgStack_110 = (gen_ctx *)0x155267;
      pMVar16 = MIR_new_label(pMVar6);
      pgStack_110 = (gen_ctx *)0x15527c;
      MIR_insert_insn_before(pMVar6,pgVar46->curr_func_item,pMVar20,pMVar16);
      pgStack_110 = (gen_ctx *)0x155290;
      add_new_bb_insn(pgVar46,pMVar16,*(bb_t_conflict *)((long)pMVar20->data + 0x30),0);
      pMVar20 = pMVar16;
    }
    pgVar17 = local_c8;
    pgStack_110 = (gen_ctx *)0x1552a8;
    MIR_new_label_op((MIR_context_t)local_c8,pMVar20);
    uStack_e8 = uStack_78;
    uStack_e0 = uStack_70;
    uStack_108 = local_98;
    uStack_100 = uStack_90;
    local_f8 = uStack_88;
    uStack_f0 = uStack_80;
    pgStack_110 = (gen_ctx *)0x1552d4;
    pMVar16 = MIR_new_insn((MIR_context_t)pgVar17,MIR_JMP);
    pgStack_110 = (gen_ctx *)0x1552eb;
    MIR_insert_insn_after((MIR_context_t)pgVar17,pgVar46->curr_func_item,local_d0,pMVar16);
    pgStack_110 = (gen_ctx *)0x1552f6;
    pgVar17 = (gen_ctx *)create_bb(pgVar46,pMVar16);
    pgStack_110 = (gen_ctx *)0x155307;
    insert_new_bb_after(pgVar46,(bb_t_conflict)bb,(bb_t_conflict)pgVar17);
    pVVar3 = pgVar46->temp_bitmap;
    if (pVVar3 == (bitmap_t)0x0) {
      pgStack_110 = (gen_ctx *)0x15579d;
      clone_bbs_cold_4();
LAB_0015579d:
      pgStack_110 = (gen_ctx *)0x1557a2;
      clone_bbs_cold_3();
LAB_001557a2:
      pgStack_110 = (gen_ctx *)0x1557a7;
      clone_bbs_cold_6();
LAB_001557a7:
      pgStack_110 = (gen_ctx *)0x1557c6;
      __assert_fail("next_insn->code == MIR_LABEL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x819,"int clone_bbs(gen_ctx_t)");
    }
    uVar13 = **(ulong **)((long)pMVar20->data + 0x30);
    if ((uVar13 < pVVar3->els_num << 6) && ((pVVar3->varr[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
       ) {
      pVVar22 = local_d8->data_flow_ctx->worklist;
      if (pVVar22->varr == (bb_t_conflict *)0x0) goto LAB_0015579d;
      uVar13 = pVVar22->els_num + 1;
      if (pVVar22->size < uVar13) {
        sVar54 = (uVar13 >> 1) + uVar13;
        pgStack_110 = (gen_ctx *)0x155382;
        local_d0 = pMVar20;
        ppbVar14 = (bb_t_conflict *)realloc(pVVar22->varr,sVar54 * 8);
        pVVar22->varr = ppbVar14;
        pVVar22->size = sVar54;
        pMVar20 = local_d0;
      }
      sVar54 = pVVar22->els_num;
      pVVar22->els_num = sVar54 + 1;
      pVVar22->varr[sVar54] = (bb_t_conflict)pgVar17;
    }
    pgVar46 = local_d8;
    pgStack_110 = (gen_ctx *)0x1553bf;
    create_edge(local_d8,(bb_t_conflict)bb,(bb_t_conflict)pgVar17,1,1);
    pgStack_110 = (gen_ctx *)0x1553e2;
    create_edge(pgVar46,(bb_t_conflict)bb,
                *(bb_t_conflict *)((long)(local_c0->ops[0].u.ref)->data + 0x30),0,1);
    pbVar26 = *(bb_t_conflict *)((long)pMVar20->data + 0x30);
  }
  else {
    if (*(int *)&local_c0->field_0x18 == 0x76) {
      pMVar19 = local_c0->ops[0].u.ref;
      pgStack_110 = (gen_ctx *)0x1554df;
      pcVar39 = (char *)bb;
      create_edge(local_d8,(bb_t_conflict)bb,*(bb_t_conflict *)((long)pMVar19->data + 0x30),0,1);
      pVVar3 = pgVar46->temp_bitmap;
      if (pVVar3 != (bitmap_t)0x0) {
        uVar12 = *(uint *)((long)pMVar19->data + 0xc);
        if ((pVVar3->els_num << 6 <= (ulong)uVar12) ||
           ((pVVar3->varr[uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) == 0)) goto LAB_001553ff;
        pgVar37 = (gen_ctx_t)pgVar46->data_flow_ctx->worklist;
        gen_ctx_00 = (gen_ctx_t)pgVar37->curr_func_item;
        pgVar49 = (gen_ctx *)0x0;
        pgVar55 = pgVar17;
        if (gen_ctx_00 != (gen_ctx_t)0x0) {
          puVar18 = (undefined1 *)((long)&pgVar37->ctx->gen_ctx + 1);
          if (*(undefined1 **)&pgVar37->optimize_level < puVar18) {
            pgStack_110 = (gen_ctx *)0x155552;
            pMVar19 = (MIR_item_t)realloc(gen_ctx_00,(long)(puVar18 + ((ulong)puVar18 >> 1)) * 8);
            pgVar37->curr_func_item = pMVar19;
            *(undefined1 **)&pgVar37->optimize_level = puVar18 + ((ulong)puVar18 >> 1);
          }
          pMVar6 = pgVar37->ctx;
          pgVar37->ctx = (MIR_context_t)((long)&pMVar6->gen_ctx + 1);
          (&pgVar37->curr_func_item->data)[(long)pMVar6] = bb;
          goto LAB_001553ff;
        }
LAB_001557cb:
        pgStack_110 = (gen_ctx *)0x1557d0;
        clone_bbs_cold_5();
LAB_001557d0:
        pgStack_110 = (gen_ctx *)build_ssa;
        clone_bbs_cold_7();
        iStack_180 = (int)pcVar39;
        psVar33 = gen_ctx_00->ssa_ctx;
        pgVar17 = gen_ctx_00;
        pgStack_138 = pgVar37;
        pgStack_130 = bb;
        pgStack_128 = pgVar46;
        pgStack_120 = pgVar49;
        pgStack_118 = pgVar55;
        pgStack_110 = insn_00;
        if (psVar33->arg_bb_insns == (VARR_bb_insn_t *)0x0) goto LAB_00156625;
        if (psVar33->arg_bb_insns->els_num != 0) goto LAB_001565f7;
        if (psVar33->undef_insns == (VARR_bb_insn_t *)0x0) goto LAB_0015662a;
        if (psVar33->undef_insns->els_num != 0) goto LAB_001565f7;
        pgVar17 = (gen_ctx *)psVar33->def_tab;
        pgStackY_1f8 = (gen_ctx *)0x15582a;
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)pgVar17);
        pVVar22 = gen_ctx_00->data_flow_ctx->worklist;
        pgVar37 = gen_ctx_00;
        if ((pVVar22 == (VARR_bb_t *)0x0) || (pVVar22->varr == (bb_t_conflict *)0x0)) {
          pgStackY_1f8 = (gen_ctx *)0x15661b;
          build_ssa_cold_22();
          goto LAB_0015661b;
        }
        pVVar22->els_num = 0;
        pbVar26 = (gen_ctx_00->curr_cfg->bbs).head;
        goto LAB_0015585f;
      }
      goto LAB_001557a2;
    }
    label = (local_c0->insn_link).next;
    if (*(int *)&label->field_0x18 != 0xb4) goto LAB_001557a7;
    pgVar37 = (gen_ctx_t)label->data;
    pgStack_110 = (gen_ctx *)0x15559f;
    local_c0 = label;
    MIR_new_label_op((MIR_context_t)local_c8,label);
    uStack_e8 = uStack_48;
    uStack_e0 = uStack_40;
    uStack_108 = local_68;
    uStack_100 = uStack_60;
    local_f8 = uStack_58;
    uStack_f0 = uStack_50;
    pgStack_110 = (gen_ctx *)0x1555ce;
    pMVar20 = MIR_new_insn((MIR_context_t)pgVar55,MIR_JMP);
    pgVar46 = local_d8;
    pgStack_110 = (gen_ctx *)0x1555ea;
    MIR_insert_insn_after((MIR_context_t)pgVar55,local_d8->curr_func_item,local_d0,pMVar20);
    pgStack_110 = (gen_ctx *)0x1555fb;
    pcVar39 = (char *)create_bb_insn(pgVar46,pMVar20,(bb_t_conflict)bb);
    pgStack_110 = (gen_ctx *)0x155608;
    gen_ctx_00 = local_b8;
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)local_b8,(bb_insn_t_conflict)pcVar39);
    pVVar3 = pgVar46->temp_bitmap;
    pgVar49 = pgVar46;
    if (pVVar3 == (bitmap_t)0x0) {
      pgStack_110 = (gen_ctx *)0x1557cb;
      clone_bbs_cold_8();
      goto LAB_001557cb;
    }
    uVar12 = *(uint *)&pgVar37->field_0xc;
    if (((ulong)uVar12 < pVVar3->els_num << 6) &&
       ((pVVar3->varr[uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) != 0)) {
      pgVar37 = (gen_ctx_t)pgVar46->data_flow_ctx->worklist;
      gen_ctx_00 = (gen_ctx_t)pgVar37->curr_func_item;
      if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_001557d0;
      puVar18 = (undefined1 *)((long)&pgVar37->ctx->gen_ctx + 1);
      if (*(undefined1 **)&pgVar37->optimize_level < puVar18) {
        pgStack_110 = (gen_ctx *)0x155670;
        pMVar19 = (MIR_item_t)realloc(gen_ctx_00,(long)(puVar18 + ((ulong)puVar18 >> 1)) * 8);
        pgVar37->curr_func_item = pMVar19;
        *(undefined1 **)&pgVar37->optimize_level = puVar18 + ((ulong)puVar18 >> 1);
      }
      pMVar6 = pgVar37->ctx;
      pgVar37->ctx = (MIR_context_t)((long)&pMVar6->gen_ctx + 1);
      (&pgVar37->curr_func_item->data)[(long)pMVar6] = bb;
    }
    pbVar26 = *(bb_t_conflict *)((long)local_c0->data + 0x30);
    pgVar17 = bb;
  }
  pgStack_110 = (gen_ctx *)0x1553ff;
  create_edge(pgVar46,(bb_t_conflict)pgVar17,pbVar26,0,1);
LAB_001553ff:
  func = local_b0;
  pgVar17 = local_c8;
  if (((FILE *)pgVar46->debug_file != (FILE *)0x0) && (1 < pgVar46->debug_level)) {
    pgStack_110 = (gen_ctx *)0x15542b;
    fprintf((FILE *)pgVar46->debug_file,"  Result BB%lu:\n",(gen_ctx *)bb->ctx);
    pgStack_110 = (gen_ctx *)0x155436;
    output_in_edges(pgVar46,(bb_t_conflict)bb);
    pgStack_110 = (gen_ctx *)0x155441;
    output_out_edges(pgVar46,(bb_t_conflict)bb);
    for (pbVar29 = (bb_insn_t)((MIR_module *)&bb->temp_bitmap)->data; pbVar29 != (bb_insn_t)0x0;
        pbVar29 = (pbVar29->bb_insn_link).next) {
      pgStack_110 = (gen_ctx *)0x155460;
      fprintf((FILE *)pgVar46->debug_file,"  %-5lu",(ulong)pbVar29->index);
      pgStack_110 = (gen_ctx *)0x155478;
      MIR_output_insn((MIR_context_t)pgVar17,pgVar46->debug_file,pbVar29->insn,func.func,1);
    }
  }
  pVVar15 = pgVar46->data_flow_ctx->worklist;
  bVar30 = false;
  iVar45 = 1;
  bVar57 = pVVar15 == (VARR_bb_t *)0x0;
  uVar13 = local_a0;
  pgVar46 = local_a8;
  if (bVar57) goto LAB_001556d5;
  goto LAB_0015503f;
LAB_0015585f:
  if (pbVar26 == (bb_t_conflict)0x0) goto LAB_001558c2;
  pgVar49 = (gen_ctx *)gen_ctx_00->data_flow_ctx->worklist;
  pgVar17 = (gen_ctx *)pgVar49->curr_func_item;
  if (pgVar17 == (gen_ctx *)0x0) goto LAB_001565d9;
  pcVar21 = (c2mir_ctx *)((long)&((gen_ctx *)pgVar49->ctx)->ctx + 1);
  if (*(c2mir_ctx **)&pgVar49->optimize_level < pcVar21) {
    pgVar55 = (gen_ctx *)(pcVar21 + ((ulong)pcVar21 >> 1));
    pcVar39 = (char *)((long)pgVar55 * 8);
    pgStackY_1f8 = (gen_ctx *)0x1558a2;
    pMVar19 = (MIR_item_t)realloc(pgVar17,(size_t)pcVar39);
    pgVar49->curr_func_item = pMVar19;
    *(gen_ctx **)&pgVar49->optimize_level = pgVar55;
  }
  pgVar34 = (gen_ctx *)pgVar49->ctx;
  pgVar49->ctx = (MIR_context_t)((long)&pgVar34->ctx + 1);
  (&pgVar49->curr_func_item->data)[(long)pgVar34] = pbVar26;
  pbVar26 = (pbVar26->bb_link).next;
  goto LAB_0015585f;
LAB_001558c2:
  pVVar22 = gen_ctx_00->data_flow_ctx->worklist;
  if (pVVar22 != (VARR_bb_t *)0x0) {
    pcVar39 = (char *)pVVar22->els_num;
    pgVar17 = (gen_ctx *)pVVar22->varr;
    pgStackY_1f8 = (gen_ctx *)0x1558f2;
    qsort(pgVar17,(size_t)pcVar39,8,rpost_cmp);
    pVVar28 = gen_ctx_00->ssa_ctx->phis;
    if ((pVVar28 == (VARR_bb_insn_t *)0x0) || (pVVar28->varr == (bb_insn_t_conflict *)0x0)) {
LAB_0015661b:
      pgStackY_1f8 = (gen_ctx *)0x156620;
      build_ssa_cold_20();
    }
    else {
      pVVar28->els_num = 0;
      pVVar22 = gen_ctx_00->data_flow_ctx->worklist;
      if (pVVar22 != (VARR_bb_t *)0x0) {
        lStack_1a8 = 0;
        piVar31 = (int *)0x0;
        pgVar34 = pgVar55;
        do {
          pgVar55 = pgVar34;
          if ((undefined1 *)pVVar22->els_num <= piVar31) goto LAB_00155b8a;
          if (pVVar22->varr == (bb_t_conflict *)0x0) goto LAB_001565d4;
          piVar11 = piVar31;
          piVar9 = piStack_188;
          for (pbVar24 = (pVVar22->varr[(long)piVar31]->bb_insns).head; piStack_188 = piVar11,
              pbVar24 != (bb_insn_t_conflict)0x0; pbVar24 = (pbVar24->bb_insn_link).next) {
            if (*(int *)&pbVar24->insn->field_0x18 != 0xba) {
              lStack_1a8 = lStack_1a8 + 1;
              pbVar26 = pbVar24->bb;
              pgVar46 = (gen_ctx *)pbVar24->insn;
              uVar41 = (ulong)*(uint *)((long)&pgVar46->debug_file + 4);
              uVar13 = 0;
              bb = (gen_ctx *)0x0;
              pgVar36 = gen_ctx_00;
              do {
                bVar57 = true;
                uVar38 = uVar13;
                pgVar55 = bb;
                if (uVar13 < uVar41) {
                  do {
                    uVar13 = uVar38;
                    pgVar17 = (gen_ctx *)gen_ctx_00->ctx;
                    pgStackY_1f8 = (gen_ctx *)0x1559c0;
                    pcVar39 = (char *)pgVar46;
                    MIR_insn_op_mode((MIR_context_t)pgVar17,(MIR_insn_t_conflict)pgVar46,uVar13,
                                     (int *)&dStack_1a0);
                    if (((int)dStack_1a0.bb == 0) ||
                       (bb = pgVar55,
                       *(char *)(pgVar46->call_used_hard_regs + uVar13 * 6 + -8) == '\v')) {
                      if (pgVar55 < (gen_ctx *)&DAT_00000002) {
                        while (*(char *)(pgVar46->call_used_hard_regs + uVar13 * 6 + -8) == '\v') {
                          pcVar39 = (char *)(ulong)(pgVar55 != (gen_ctx *)0x0);
                          uVar12 = *(uint *)((long)pgVar46->call_used_hard_regs +
                                            (long)pcVar39 * 4 + uVar13 * 0x30 + -0x28);
                          insn_00 = (gen_ctx *)(ulong)uVar12;
                          if (uVar12 != 0xffffffff) goto LAB_00155a42;
                          if (pgVar55 != (gen_ctx *)0x0) goto LAB_00155a20;
                          pgVar55 = (gen_ctx *)&DAT_00000001;
                        }
                        if (*(char *)(pgVar46->call_used_hard_regs + uVar13 * 6 + -8) == '\x02') {
                          bb = (gen_ctx *)0x0;
                          if (pgVar55 == (gen_ctx *)&DAT_00000001) goto LAB_00155a23;
                          insn_00 = (gen_ctx *)
                                    (ulong)*(uint *)(pgVar46->call_used_hard_regs + uVar13 * 6 + -7)
                          ;
LAB_00155a42:
                          bb = (gen_ctx *)((long)&pgVar55->ctx + 1);
                          pgVar36 = (gen_ctx_t)(uVar13 & 0xffffffff);
                          bVar57 = false;
                          goto LAB_00155a4d;
                        }
                      }
LAB_00155a20:
                      bb = (gen_ctx *)0x0;
                    }
LAB_00155a23:
                    uVar38 = uVar13 + 1;
                    pgVar55 = bb;
                  } while (uVar38 != uVar41);
                  pgVar36 = (gen_ctx_t)(uVar13 & 0xffffffff);
                  bVar57 = true;
                  uVar13 = uVar38;
                }
LAB_00155a4d:
                if (bVar57) goto LAB_00155a8b;
                if ((uint)insn_00 < 0x22) {
                  pgStackY_1f8 = (gen_ctx *)0x15655e;
                  __assert_fail("var > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0xa4d,"void process_bb_insn_for_ssa(gen_ctx_t, bb_insn_t)");
                }
                pcVar39 = (char *)((ulong)insn_00 & 0xffffffff);
                pgStackY_1f8 = (gen_ctx *)0x155a6b;
                pgVar17 = gen_ctx_00;
                pbVar23 = get_def(gen_ctx_00,(uint)insn_00,pbVar26);
                pbVar24->insn->ops[(int)pgVar36].data = pbVar23;
              } while( true );
            }
LAB_00155b62:
            piVar11 = piStack_188;
            piVar9 = piStack_188;
          }
          piVar31 = (int *)((long)piVar31 + 1);
          pVVar22 = gen_ctx_00->data_flow_ctx->worklist;
          pgVar55 = (gen_ctx *)0x0;
          pgVar34 = (gen_ctx *)0x0;
          piStack_188 = piVar9;
        } while (pVVar22 != (VARR_bb_t *)0x0);
      }
      pgStackY_1f8 = (gen_ctx *)0x155b8a;
      build_ssa_cold_19();
LAB_00155b8a:
      psVar33 = gen_ctx_00->ssa_ctx;
      pVVar28 = psVar33->phis;
      if (pVVar28 == (VARR_bb_insn_t *)0x0) {
LAB_001565de:
        pgStackY_1f8 = (gen_ctx *)0x1565e3;
        build_ssa_cold_17();
        goto LAB_001565e3;
      }
      if (pVVar28->els_num != 0) {
        pgVar37 = (gen_ctx_t)0x0;
        do {
          if (pVVar28->varr == (bb_insn_t_conflict *)0x0) goto LAB_001565e8;
          pgVar49 = (gen_ctx *)pVVar28->varr[(long)pgVar37];
          pgVar55 = *(gen_ctx **)&((DLIST_in_edge_t *)&pgVar49->addr_insn_p)->head->fall_through_p;
          if (pgVar55 != (gen_ctx *)0x0) {
            uVar12 = ((gen_ctx *)pgVar49->ctx)->addr_insn_p;
            insn_00 = (gen_ctx *)(ulong)uVar12;
            bb = (gen_ctx *)0x50;
            do {
              pcVar39 = (char *)(ulong)uVar12;
              pgStackY_1f8 = (gen_ctx *)0x155be2;
              pgVar17 = gen_ctx_00;
              pbVar24 = get_def(gen_ctx_00,uVar12,(bb_t_conflict)pgVar55->ctx);
              *(bb_insn_t_conflict *)((long)&((gen_ctx *)pgVar49->ctx)->ctx + (long)bb) = pbVar24;
              pgVar55 = (gen_ctx *)pgVar55->debug_file;
              bb = (gen_ctx *)((long)bb + 0x30);
            } while (pgVar55 != (gen_ctx *)0x0);
          }
          psVar33 = gen_ctx_00->ssa_ctx;
          pVVar28 = psVar33->phis;
          if (pVVar28 == (VARR_bb_insn_t *)0x0) goto LAB_001565de;
          pgVar37 = (gen_ctx_t)((long)&pgVar37->ctx + 1);
          pgVar46 = gen_ctx_00;
        } while (pgVar37 < (gen_ctx_t)pVVar28->els_num);
      }
      pVVar28 = psVar33->deleted_phis;
      if ((pVVar28 != (VARR_bb_insn_t *)0x0) && (pVVar28->varr != (bb_insn_t_conflict *)0x0)) {
        pgVar49 = (gen_ctx *)0x1ffffffff;
        pVVar28->els_num = 0;
LAB_00155c40:
        psVar33 = gen_ctx_00->ssa_ctx;
        pVVar28 = psVar33->phis;
        if (pVVar28 == (VARR_bb_insn_t *)0x0) {
LAB_00156582:
          pgStackY_1f8 = (gen_ctx *)0x156587;
          build_ssa_cold_15();
LAB_00156587:
          pgStackY_1f8 = (gen_ctx *)0x15658c;
          build_ssa_cold_14();
LAB_0015658c:
          pgStackY_1f8 = (gen_ctx *)0x1565ab;
          __assert_fail("phi->insn->ops[0].mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x8b0,"bb_insn_t redundant_phi_def(gen_ctx_t, bb_insn_t, int *)");
        }
        pgVar46 = (gen_ctx *)0x0;
        pgVar55 = (gen_ctx *)0x0;
        bb = (gen_ctx *)0x0;
        while( true ) {
          pcVar39 = (char *)pVVar28->els_num;
          ppbVar25 = pVVar28->varr;
          if (pcVar39 <= bb) break;
          if (ppbVar25 == (bb_insn_t_conflict *)0x0) goto LAB_00156587;
          insn_00 = (gen_ctx *)ppbVar25[(long)bb];
          pMVar6 = insn_00->ctx;
          if (*(ulong *)&pMVar6->func_redef_permission_p < 0x200000000) {
            uVar13 = *(ulong *)&pMVar6->func_redef_permission_p >> 0x20;
            bVar57 = false;
          }
          else {
            uVar41 = 1;
            do {
              pbVar48 = ((DLIST_LINK_bb_t *)&pMVar6->insn_nops)[uVar41 * 3].prev;
              do {
                pbVar43 = pbVar48;
                if (*(int *)(pbVar43->index + 0x18) != 0xba) break;
                pbVar48 = *(bb_t *)(pbVar43->index + 0x20);
              } while (pbVar43 != pbVar48);
              ((DLIST_LINK_bb_t *)&pMVar6->insn_nops)[uVar41 * 3].prev = pbVar43;
              uVar41 = uVar41 + 1;
              uVar13 = *(ulong *)&pMVar6->func_redef_permission_p >> 0x20;
            } while (uVar41 < uVar13);
            bVar57 = 0x1ffffffff < *(ulong *)&pMVar6->func_redef_permission_p;
          }
          if (bVar57) {
            lVar40 = uVar13 - 1;
            pMVar42 = &pMVar6->environment_module;
            pgVar17 = (gen_ctx *)0x0;
            do {
              pgVar34 = (gen_ctx *)pMVar42->data;
              if ((pgVar34 != insn_00 && pgVar34 != pgVar17) &&
                 (bVar57 = pgVar17 != (gen_ctx *)0x0, pgVar17 = pgVar34, bVar57)) {
                pgVar17 = (gen_ctx *)0x0;
                goto LAB_00155d3d;
              }
              pMVar42 = (MIR_module *)&pMVar42->last_temp_item_num;
              lVar40 = lVar40 + -1;
            } while (lVar40 != 0);
          }
          else {
            pgVar17 = (gen_ctx *)0x0;
          }
          if (*(char *)&pMVar6->unspec_protos != '\x02') goto LAB_0015658c;
          if (pgVar17 == (gen_ctx *)0x0) {
            pgStackY_1f8 = (gen_ctx *)0x155d39;
            pgVar17 = (gen_ctx *)
                      get_fake_insn(gen_ctx_00,psVar33->undef_insns,
                                    *(MIR_reg_t *)&((DLIST_in_edge_t *)&pMVar6->temp_string)->head);
          }
LAB_00155d3d:
          if (pgVar17 == (gen_ctx *)0x0) {
            pVVar28 = gen_ctx_00->ssa_ctx->phis;
            if (((pVVar28 == (VARR_bb_insn_t *)0x0) || (pVVar28->varr == (bb_insn_t_conflict *)0x0))
               || ((gen_ctx *)pVVar28->els_num <= pgVar55)) {
              pgStackY_1f8 = (gen_ctx *)0x156582;
              build_ssa_cold_13();
              goto LAB_00156582;
            }
            ppbVar25 = pVVar28->varr + (long)pgVar55;
            pgVar55 = (gen_ctx *)((long)&pgVar55->ctx + 1);
          }
          else {
            ((MIR_op_t *)&insn_00->ctx->insn_nops)->data = pgVar17;
            if (insn_00 == pgVar17) {
              pgStackY_1f8 = (gen_ctx *)0x1565ca;
              __assert_fail("phi != def",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x912,"void minimize_ssa(gen_ctx_t, size_t)");
            }
            pVVar28 = gen_ctx_00->ssa_ctx->deleted_phis;
            if (pVVar28->varr == (bb_insn_t_conflict *)0x0) {
              pgStackY_1f8 = (gen_ctx *)0x1565cf;
              build_ssa_cold_12();
              goto LAB_001565cf;
            }
            uVar13 = pVVar28->els_num + 1;
            if (pVVar28->size < uVar13) {
              sVar54 = (uVar13 >> 1) + uVar13;
              pgStackY_1f8 = (gen_ctx *)0x155d8d;
              ppbVar25 = (bb_insn_t_conflict *)realloc(pVVar28->varr,sVar54 * 8);
              pVVar28->varr = ppbVar25;
              pVVar28->size = sVar54;
            }
            sVar54 = pVVar28->els_num;
            pVVar28->els_num = sVar54 + 1;
            ppbVar25 = pVVar28->varr + sVar54;
            pgVar46 = (gen_ctx *)&DAT_00000001;
          }
          *ppbVar25 = (bb_insn_t_conflict)insn_00;
          bb = (gen_ctx *)((long)&bb->ctx + 1);
          psVar33 = gen_ctx_00->ssa_ctx;
          pVVar28 = psVar33->phis;
          if (pVVar28 == (VARR_bb_insn_t *)0x0) goto LAB_00156582;
        }
        if ((ppbVar25 != (bb_insn_t_conflict *)0x0) && (pgVar55 <= pcVar39)) goto code_r0x00155e16;
LAB_001565cf:
        pgStackY_1f8 = (gen_ctx *)0x1565d4;
        build_ssa_cold_11();
LAB_001565d4:
        pgStackY_1f8 = (gen_ctx *)0x1565d9;
        build_ssa_cold_18();
LAB_001565d9:
        pgStackY_1f8 = (gen_ctx *)0x1565de;
        build_ssa_cold_1();
        goto LAB_001565de;
      }
    }
    pgStackY_1f8 = (gen_ctx *)0x156625;
    build_ssa_cold_16();
LAB_00156625:
    pgStackY_1f8 = (gen_ctx *)0x15662a;
    build_ssa_cold_24();
LAB_0015662a:
    gen_ctx_00 = pgVar37;
    pgStackY_1f8 = (gen_ctx *)0x15662f;
    build_ssa_cold_23();
  }
  pgStackY_1f8 = (gen_ctx *)0x156634;
  build_ssa_cold_21();
  pgVar37 = gen_ctx_00;
LAB_00156634:
  gen_ctx_00 = pgVar37;
  pgStackY_1f8 = (gen_ctx *)0x156639;
  build_ssa_cold_9();
LAB_00156639:
  pgStackY_1f8 = (gen_ctx *)0x15663e;
  build_ssa_cold_8();
  goto LAB_0015663e;
LAB_00155a8b:
  pgVar49 = (gen_ctx *)pbVar24->insn;
  pgVar55 = (gen_ctx *)(ulong)*(uint *)((long)&pgVar49->debug_file + 4);
  pbStack_1c8 = (bb_insn_t)&pgVar49->addr_insn_p;
  pgVar46 = (gen_ctx *)0x0;
  do {
    bb = (gen_ctx *)CONCAT71((int7)((ulong)bb >> 8),1);
    if (pgVar46 < pgVar55) {
      pDVar56 = (DLIST_in_edge_t *)((long)pbStack_1c8 + (long)pgVar46 * 3 * 0x10);
      do {
        pgVar34 = pgVar46;
        pgVar17 = (gen_ctx *)gen_ctx_00->ctx;
        pgStackY_1f8 = (gen_ctx *)0x155ad1;
        pcVar39 = (char *)pgVar49;
        MIR_insn_op_mode((MIR_context_t)pgVar17,(MIR_insn_t_conflict)pgVar49,(size_t)pgVar34,
                         &iStack_17c);
        if ((iStack_17c != 0) && (*(char *)&((DLIST_LINK_bb_t *)(pDVar56 + -1))->next != '\v')) {
          if (*(char *)&((DLIST_LINK_bb_t *)(pDVar56 + -1))->next != '\x02') goto LAB_001564b2;
          insn_00 = (gen_ctx *)(ulong)*(uint *)&pDVar56->head;
          bb = (gen_ctx *)0x0;
          break;
        }
        pgVar46 = (gen_ctx *)((long)&pgVar34->ctx + 1);
        pDVar56 = pDVar56 + 3;
      } while (pgVar55 != pgVar46);
      pgVar46 = (gen_ctx *)((long)&pgVar34->ctx + 1);
    }
    piVar31 = piStack_188;
    if ((char)bb != '\0') goto LAB_00155b62;
    dStack_1a0.reg = (MIR_reg_t)insn_00;
    pgVar17 = (gen_ctx *)gen_ctx_00->ssa_ctx->def_tab;
    el._12_4_ = dStack_1a0._12_4_;
    el.reg = dStack_1a0.reg;
    pcVar39 = &DAT_00000002;
    pgStackY_1f8 = (gen_ctx *)0x155b53;
    el.bb = pbVar26;
    el.def = pbVar24;
    dStack_1a0.bb = pbVar26;
    dStack_1a0.def = pbVar24;
    HTAB_def_tab_el_t_do((HTAB_def_tab_el_t *)pgVar17,el,HTAB_REPLACE,&dStack_1a0);
  } while( true );
code_r0x00155e16:
  pVVar28->els_num = (size_t)pgVar55;
  if ((int)pgVar46 == 0) goto code_r0x00155e22;
  goto LAB_00155c40;
LAB_00156827:
  if (*(int *)&pMVar20->field_0x1c != 0) {
    uVar13 = 0;
    do {
      pMVar52->data = (void *)0x0;
      uVar13 = uVar13 + 1;
      pMVar52 = pMVar52 + 1;
    } while (uVar13 < *(uint *)&pMVar20->field_0x1c);
  }
  pbVar29 = (pbStackY_260->bb_insn_link).next;
  goto LAB_00156723;
code_r0x00155e22:
  pgVar17 = (gen_ctx *)gen_ctx_00->debug_file;
  if ((pgVar17 != (gen_ctx *)0x0) && (1 < gen_ctx_00->debug_level)) {
    if (psVar33->deleted_phis == (VARR_bb_insn_t *)0x0) goto LAB_00156643;
    pcVar39 = "Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n";
    pgStackY_1f8 = (gen_ctx *)0x155e5a;
    fprintf((FILE *)pgVar17,"Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n",
            (long)pgVar55->call_used_hard_regs + (psVar33->deleted_phis->els_num - 0x68),pgVar55,
            lStack_1a8);
  }
  pbVar26 = (gen_ctx_00->curr_cfg->bbs).head;
  if (pbVar26 != (bb_t_conflict)0x0) {
    uVar13 = 0;
    do {
      pbVar29 = (pbVar26->bb_insns).head;
      while (pbVar32 = pbVar29, pbVar32 != (bb_insn_t)0x0) {
        pgVar55 = (gen_ctx *)pbVar32->insn;
        pgVar46 = (gen_ctx *)(ulong)*(uint *)((long)&pgVar55->debug_file + 4);
        insn_00 = (gen_ctx *)&pgVar55->debug_level;
        bb = (gen_ctx *)0x0;
        uVar41 = 0;
LAB_00155e97:
        pgVar49 = (gen_ctx *)CONCAT71((int7)((ulong)pgVar49 >> 8),1);
        uVar38 = uVar41;
        if (bb < pgVar46) {
          do {
            pgVar34 = bb;
            pgVar17 = (gen_ctx *)gen_ctx_00->ctx;
            pgStackY_1f8 = (gen_ctx *)0x155ec1;
            pcVar39 = (char *)pgVar55;
            MIR_insn_op_mode((MIR_context_t)pgVar17,(MIR_insn_t_conflict)pgVar55,(size_t)pgVar34,
                             (int *)&dStack_1a0);
            if (((int)dStack_1a0.bb == 0) ||
               (uVar41 = uVar38,
               *(char *)&((DLIST_LINK_bb_t *)((long)insn_00 + (long)pgVar34 * 3 * 0x10))->next ==
               '\v')) {
              if (uVar38 < 2) {
                if (*(char *)&((DLIST_LINK_bb_t *)((long)insn_00 + (long)pgVar34 * 3 * 0x10))->next
                    == '\v') {
                  do {
                    if (*(int *)((long)&((DLIST_LINK_bb_t *)
                                        ((long)insn_00 + ((long)pgVar34 * 3 + 2) * 0x10))->prev +
                                (ulong)(uVar38 != 0) * 4) != -1) goto LAB_00155f33;
                    uVar38 = uVar38 + 1;
                  } while (uVar38 == 1);
                }
                else if (uVar38 != 1) {
                  uVar41 = 0;
                  if (*(char *)&((DLIST_LINK_bb_t *)((long)insn_00 + (long)pgVar34 * 3 * 0x10))->
                                next != '\x02') goto LAB_00155f1d;
LAB_00155f33:
                  uVar41 = uVar38 + 1;
                  pgVar49 = (gen_ctx *)0x0;
                  bb = pgVar34;
                  break;
                }
              }
              uVar41 = 0;
            }
LAB_00155f1d:
            bb = (gen_ctx *)((long)&pgVar34->ctx + 1);
            uVar38 = uVar41;
          } while (bb != pgVar46);
          uVar13 = (ulong)pgVar34 & 0xffffffff;
        }
        if ((char)pgVar49 == '\0') {
          pcVar39 = (char *)((DLIST_LINK_bb_t *)((long)insn_00 + (long)(int)uVar13 * 3 * 0x10))->
                            prev;
          if ((gen_ctx *)pcVar39 != (gen_ctx *)0x0) {
            do {
              pgVar17 = (gen_ctx *)pcVar39;
              pcVar39 = (char *)pgVar17->ctx;
              if (*(int *)&((gen_ctx *)pcVar39)->debug_file != 0xba) break;
              pcVar39 = (char *)((DLIST_LINK_bb_t *)&((gen_ctx *)pcVar39)->debug_level)->prev;
            } while (pgVar17 != (gen_ctx *)pcVar39);
            ((DLIST_LINK_bb_t *)((long)insn_00 + (long)(int)uVar13 * 3 * 0x10))->prev =
                 (bb_t)pgVar17;
          }
          goto LAB_00155e97;
        }
        pbStack_1c8 = pbVar32;
        pbVar29 = ((DLIST_bb_insn_t *)&pbVar32->bb_insn_link)->tail;
      }
      pbVar26 = (pbVar26->bb_link).next;
    } while (pbVar26 != (bb_t)0x0);
  }
  psVar33 = gen_ctx_00->ssa_ctx;
  pVVar28 = psVar33->deleted_phis;
  if (pVVar28 == (VARR_bb_insn_t *)0x0) {
LAB_001565e3:
    pgStackY_1f8 = (gen_ctx *)0x1565e8;
    build_ssa_cold_10();
LAB_001565e8:
    pgStackY_1f8 = (gen_ctx *)0x1565ed;
    build_ssa_cold_2();
LAB_001565ed:
    pgStackY_1f8 = (gen_ctx *)0x1565f2;
    build_ssa_cold_4();
LAB_001565f2:
    pgStackY_1f8 = (gen_ctx *)0x1565f7;
    build_ssa_cold_6();
LAB_001565f7:
    pgStackY_1f8 = (gen_ctx *)0x156616;
    __assert_fail("(VARR_bb_insn_tlength (gen_ctx->ssa_ctx->arg_bb_insns)) == 0 && (VARR_bb_insn_tlength (gen_ctx->ssa_ctx->undef_insns)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xa61,"void build_ssa(gen_ctx_t, int)");
  }
  pgVar37 = gen_ctx_00;
  if (pVVar28->els_num != 0) {
    pgVar37 = (gen_ctx_t)0x0;
    do {
      if (pVVar28->varr == (bb_insn_t_conflict *)0x0) goto LAB_001565ed;
      pcVar39 = (char *)pVVar28->varr[(long)pgVar37]->insn;
      pgStackY_1f8 = (gen_ctx *)0x155fe2;
      pgVar17 = gen_ctx_00;
      gen_delete_insn(gen_ctx_00,(MIR_insn_t)pcVar39);
      psVar33 = gen_ctx_00->ssa_ctx;
      pVVar28 = psVar33->deleted_phis;
      if (pVVar28 == (VARR_bb_insn_t *)0x0) goto LAB_001565e3;
      pgVar37 = (gen_ctx_t)((long)&pgVar37->ctx + 1);
      pgVar49 = gen_ctx_00;
    } while (pgVar37 < (gen_ctx_t)pVVar28->els_num);
  }
  pVVar28 = psVar33->phis;
  if (pVVar28 == (VARR_bb_insn_t *)0x0) goto LAB_00156634;
  sVar54 = pVVar28->els_num;
  if (sVar54 == 0) {
LAB_0015603e:
    pbVar26 = (gen_ctx_00->curr_cfg->bbs).head;
    while (pbVar26 != (bb_t_conflict)0x0) {
      pbVar32 = (pbVar26->bb_insns).head;
      pbVar29 = pbStack_178;
      pbVar53 = pbStack_160;
      while (pbStack_160 = pbVar26, pbStack_178 = pbVar32, pbStack_178 != (bb_insn_t)0x0) {
        pgStack_150 = (gen_ctx *)pbStack_178->insn;
        pgStack_158 = (gen_ctx *)(ulong)*(uint *)((long)&pgStack_150->debug_file + 4);
        pDStack_170 = (DLIST_LINK_bb_t *)&pgStack_150->debug_level;
        pgVar46 = (gen_ctx *)0x0;
        bb = pgStack_158;
        pgVar49 = (gen_ctx *)0x0;
        pgVar55 = pgStack_150;
LAB_00156095:
        insn_00 = (gen_ctx *)CONCAT71((int7)((ulong)insn_00 >> 8),1);
        pgVar34 = pgVar49;
        if (pgVar46 < bb) {
          do {
            pgVar17 = (gen_ctx *)gen_ctx_00->ctx;
            pgStackY_1f8 = (gen_ctx *)0x1560ba;
            pcVar39 = (char *)pgVar55;
            MIR_insn_op_mode((MIR_context_t)pgVar17,(MIR_insn_t_conflict)pgVar55,(size_t)pgVar46,
                             (int *)&dStack_1a0);
            iStack_1ac = (int)pgVar46;
            if (((int)dStack_1a0.bb == 0) ||
               (pgVar49 = pgVar34, *(char *)&pDStack_170[(long)pgVar46 * 3].next == '\v')) {
              if (pgVar34 < (gen_ctx *)&DAT_00000002) {
                while (*(char *)&pDStack_170[(long)pgVar46 * 3].next == '\v') {
                  uVar12 = *(uint *)((long)&pDStack_170[(long)pgVar46 * 3 + 2].prev +
                                    (ulong)(pgVar34 != (gen_ctx *)0x0) * 4);
                  pcVar39 = (char *)(ulong)uVar12;
                  pbStack_1c8 = (bb_insn_t)(ulong)uVar12;
                  if (uVar12 != 0xffffffff) goto LAB_00156142;
                  if (pgVar34 != (gen_ctx *)0x0) goto LAB_00156121;
                  pgVar34 = (gen_ctx *)&DAT_00000001;
                }
                if (*(char *)&pDStack_170[(long)pgVar46 * 3].next == '\x02') {
                  pgVar49 = (gen_ctx *)0x0;
                  if (pgVar34 == (gen_ctx *)&DAT_00000001) goto LAB_00156124;
                  pbStack_1c8 = (bb_insn_t)(ulong)*(uint *)&pDStack_170[(long)pgVar46 * 3 + 1].prev;
LAB_00156142:
                  pgVar49 = (gen_ctx *)((long)&pgVar34->ctx + 1);
                  insn_00 = (gen_ctx *)0x0;
                  break;
                }
              }
LAB_00156121:
              pgVar49 = (gen_ctx *)0x0;
            }
LAB_00156124:
            pgVar46 = (gen_ctx *)((long)&pgVar46->ctx + 1);
            pgVar34 = pgVar49;
          } while (pgVar46 != bb);
        }
        if ((char)insn_00 == '\0') {
          if (0x21 < (uint)pbStack_1c8) {
            pgVar17 = (gen_ctx *)pDStack_170[(long)iStack_1ac * 3].prev;
            pgStack_140 = pgVar49;
            if (pgVar17 == (gen_ctx *)0x0) {
              pgStackY_1f8 = (gen_ctx *)0x15657d;
              __assert_fail("def != ((void*)0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x9b2,
                            "void process_insn_inputs_for_ssa_def_use_repr(gen_ctx_t, bb_insn_t)");
            }
            pDStack_170[(long)iStack_1ac * 3].prev = (bb_t)0x0;
            insn_00 = (gen_ctx *)pgVar17->ctx;
            uVar38 = (ulong)insn_00->debug_file >> 0x20;
            piVar31 = &insn_00->addr_insn_p;
            uVar13 = 0;
            uVar41 = uVar38;
            piStack_188 = piVar31;
            uStack_168 = uVar38;
            pgStack_148 = pgVar17;
            do {
              bVar57 = true;
              if (uVar13 < uVar41) {
                ppVVar50 = (bitmap_t *)(piStack_188 + uVar13 * 0xc);
                lVar40 = 0;
                do {
                  bb = (gen_ctx *)(uVar13 + lVar40);
                  pgStackY_1f8 = (gen_ctx *)0x156211;
                  MIR_insn_op_mode(gen_ctx_00->ctx,(MIR_insn_t_conflict)insn_00,(size_t)bb,
                                   (int *)&dStack_1a0);
                  uVar41 = uStack_168;
                  if (((int)dStack_1a0.bb != 0) && (*(char *)(ppVVar50 + -1) != '\v')) {
                    if (*(char *)(ppVVar50 + -1) != '\x02') goto LAB_001564b2;
                    piVar31 = (int *)(ulong)*(uint *)ppVVar50;
                    uVar13 = uVar13 + 1 + lVar40;
                    bVar57 = false;
                    goto LAB_0015626e;
                  }
                  lVar40 = lVar40 + 1;
                  ppVVar50 = ppVVar50 + 6;
                } while ((uVar13 - uVar38) + lVar40 != 0);
                bb = (gen_ctx *)(ulong)(uint)((int)uVar13 + -1 + (int)lVar40);
                uVar13 = uVar13 + lVar40;
                piVar31 = (int *)((ulong)piVar31 & 0xffffffff);
                bVar57 = true;
              }
LAB_0015626e:
              if (bVar57) {
                pgStackY_1f8 = (gen_ctx *)0x15653f;
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x9a4,"int get_var_def_op_num(gen_ctx_t, MIR_reg_t, MIR_insn_t)");
              }
            } while ((uint)piVar31 != (uint)pbStack_1c8);
            pgStackY_1f8 = (gen_ctx *)0x1562a5;
            pcVar39 = (char *)pgStack_148;
            pgVar17 = gen_ctx_00;
            add_ssa_edge_1(gen_ctx_00,(bb_insn_t_conflict)pgStack_148,(int)bb,pbStack_178,iStack_1ac
                           ,0);
            bb = pgStack_158;
            pgVar49 = pgStack_140;
            pgVar55 = pgStack_150;
          }
          goto LAB_00156095;
        }
        pbVar26 = pbStack_160;
        pbVar29 = pbStack_178;
        pbVar53 = pbStack_160;
        pbVar32 = (pbStack_178->bb_insn_link).next;
      }
      pbVar26 = (pbStack_160->bb_link).next;
      pbStack_178 = pbVar29;
      pbStack_160 = pbVar53;
    }
    if (iStack_180 == 0) {
      return 0;
    }
    pVVar7 = gen_ctx_00->ssa_ctx->curr_reg_indexes;
    if ((pVVar7 != (VARR_size_t *)0x0) && (pVVar7->varr != (size_t *)0x0)) {
      pVVar7->els_num = 0;
      pfVar27 = gen_ctx_00->curr_cfg;
      for (pbVar26 = (pfVar27->bbs).head; pbVar26 != (bb_t_conflict)0x0;
          pbVar26 = (pbVar26->bb_link).next) {
        for (pbVar29 = (pbVar26->bb_insns).head; pbVar29 != (bb_insn_t)0x0;
            pbVar29 = (pbVar29->bb_insn_link).next) {
          pMVar20 = pbVar29->insn;
          uVar12 = *(uint *)&pMVar20->field_0x1c;
          uVar13 = 0;
          uVar41 = 0;
LAB_0015635c:
          bVar57 = true;
          uVar38 = uVar13;
          uVar35 = uVar41;
          if (uVar13 < uVar12) {
            do {
              uVar13 = uVar38;
              pgStackY_1f8 = (gen_ctx *)0x156380;
              MIR_insn_op_mode(gen_ctx_00->ctx,pMVar20,uVar13,(int *)&dStack_1a0);
              if (((int)dStack_1a0.bb == 0) ||
                 (uVar41 = uVar35, pMVar20->ops[uVar13].field_0x8 == '\v')) {
                if (uVar35 < 2) {
                  cVar1 = pMVar20->ops[uVar13].field_0x8;
                  while (cVar1 == '\v') {
                    uVar2 = *(uint *)((long)&pMVar20->ops[uVar13].u +
                                     (ulong)(uVar35 != 0) * 4 + 0x10);
                    insn_00 = (gen_ctx *)(ulong)uVar2;
                    if (uVar2 != 0xffffffff) goto LAB_001563fd;
                    if (uVar35 != 0) goto LAB_001563df;
                    uVar35 = 1;
                  }
                  if (cVar1 == '\x02') {
                    uVar41 = 0;
                    if (uVar35 == 1) goto LAB_001563e2;
                    insn_00 = (gen_ctx *)(ulong)pMVar20->ops[uVar13].u.reg;
LAB_001563fd:
                    uVar41 = uVar35 + 1;
                    bVar57 = false;
                    pfVar27 = (func_cfg_t)(uVar13 & 0xffffffff);
                    goto LAB_00156408;
                  }
                }
LAB_001563df:
                uVar41 = 0;
              }
LAB_001563e2:
              uVar38 = uVar13 + 1;
              uVar35 = uVar41;
            } while (uVar38 != uVar12);
            pfVar27 = (func_cfg_t)(uVar13 & 0xffffffff);
            bVar57 = true;
            uVar13 = uVar38;
          }
LAB_00156408:
          if (!bVar57) {
            if ((0x21 < (uint)insn_00) && (*(int *)&pMVar20->field_0x18 - 0x22U < 0xfffffffc)) {
              *(undefined1 *)((long)pMVar20->ops[(int)pfVar27].data + 0x10) = 0;
            }
            goto LAB_0015635c;
          }
        }
      }
      pVVar28 = gen_ctx_00->ssa_ctx->arg_bb_insns;
      if (pVVar28 != (VARR_bb_insn_t *)0x0) {
        uVar13 = 0;
        do {
          if (pVVar28->els_num <= uVar13) {
            pfVar27 = gen_ctx_00->curr_cfg;
            for (pbVar26 = (pfVar27->bbs).head; pbVar26 != (bb_t_conflict)0x0;
                pbVar26 = (pbVar26->bb_link).next) {
              for (pbVar29 = (pbVar26->bb_insns).head; pbVar29 != (bb_insn_t_conflict)0x0;
                  pbVar29 = (pbVar29->bb_insn_link).next) {
                pgStackY_1f8 = (gen_ctx *)0x1564ff;
                rename_bb_insn(gen_ctx_00,pbVar29);
                pfVar27 = extraout_RAX;
              }
            }
            return (int)pfVar27;
          }
          if (pVVar28->varr == (bb_insn_t_conflict *)0x0) goto LAB_001565f2;
          pbVar24 = pVVar28->varr[uVar13];
          if (pbVar24 != (bb_insn_t_conflict)0x0) {
            pgStackY_1f8 = (gen_ctx *)0x15649b;
            rename_bb_insn(gen_ctx_00,pbVar24);
          }
          uVar13 = uVar13 + 1;
          pVVar28 = gen_ctx_00->ssa_ctx->arg_bb_insns;
        } while (pVVar28 != (VARR_bb_insn_t *)0x0);
      }
      pgStackY_1f8 = (gen_ctx *)0x1564b2;
      build_ssa_cold_7();
LAB_001564b2:
      pgStackY_1f8 = (gen_ctx *)0x1564d1;
      __assert_fail("op_ref->mode == MIR_OP_VAR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x4ff,
                    "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                   );
    }
    goto LAB_00156639;
  }
  ppbVar25 = pVVar28->varr;
  if (ppbVar25 != (bb_insn_t_conflict *)0x0) {
    sVar44 = 0;
    do {
      pcVar39 = (char *)ppbVar25[sVar44]->insn;
      ((DLIST_LINK_bb_t *)&((gen_ctx *)pcVar39)->debug_level)->prev = (bb_t)0x0;
      sVar44 = sVar44 + 1;
    } while (sVar54 != sVar44);
    goto LAB_0015603e;
  }
LAB_0015663e:
  pgStackY_1f8 = (gen_ctx *)0x156643;
  build_ssa_cold_5();
LAB_00156643:
  pgStackY_1f8 = (gen_ctx *)print_varr_insns;
  build_ssa_cold_3();
  pgVar37 = (gen_ctx_t)pgVar17->debug_file;
  pgStackY_220 = (gen_ctx *)0x15666c;
  pgStackY_218 = gen_ctx_00;
  pgStackY_210 = bb;
  pgStackY_208 = pgVar46;
  pgStackY_200 = pgVar49;
  pgStackY_1f8 = pgVar55;
  uVar12 = fprintf((FILE *)pgVar37,"%s insns:\n",pcVar39);
  uVar13 = (ulong)uVar12;
  if (extraout_RDX != (ulong *)0x0) {
    pcVar39 = "  %-5lu";
    uVar41 = 0;
    do {
      if (*extraout_RDX <= uVar41) {
        return (int)uVar13;
      }
      uVar13 = extraout_RDX[2];
      if (uVar13 == 0) {
        pgStackY_220 = (gen_ctx *)undo_build_ssa;
        print_varr_insns_cold_1();
        pcStackY_228 = "  %-5lu";
        pgStackY_240 = bb;
        uStackY_238 = uVar41;
        pgStackY_230 = pgVar17;
        pgStackY_220 = insn_00;
        free_fake_bb_insns(pgVar37->ssa_ctx->arg_bb_insns);
        free_fake_bb_insns(pgVar37->ssa_ctx->undef_insns);
        pbVar53 = (pgVar37->curr_cfg->bbs).head;
        pbVar26 = pbStackY_268;
        do {
          pbStackY_268 = pbVar53;
          if (pbStackY_268 == (bb_t_conflict)0x0) {
            pfVar27 = pgVar37->curr_cfg;
            pbStackY_268 = pbVar26;
            for (pbVar53 = (pfVar27->bbs).head; pbVar53 != (bb_t_conflict)0x0;
                pbVar53 = (pbVar53->bb_link).next) {
              pbVar29 = (pbVar53->bb_insns).head;
              while (pbVar29 != (bb_insn_t)0x0) {
                ppMVar10 = &pbVar29->insn;
                pbVar29 = (pbVar29->bb_insn_link).next;
                if (*(int *)&(*ppMVar10)->field_0x18 == 0xba) {
                  gen_delete_insn(pgVar37,*ppMVar10);
                  pfVar27 = extraout_RAX_01;
                }
              }
            }
            return (int)pfVar27;
          }
          pbVar29 = (pbStackY_268->bb_insns).head;
LAB_00156723:
          if (pbVar29 != (bb_insn_t)0x0) {
            pMVar20 = pbVar29->insn;
            uVar41 = *(ulong *)&pMVar20->field_0x18 >> 0x20;
            pMVar52 = pMVar20->ops;
            puStackY_250 = &pMVar20->ops[0].field_0x8;
            lStackY_258 = -uVar41;
            uVar13 = 0;
            uStackY_278 = uVar41;
            pMStackY_270 = pMVar52;
            pbStackY_260 = pbVar29;
            do {
              bVar57 = true;
              if (uVar13 < uVar41) {
                pcVar47 = puStackY_250 + uVar13 * 0x30;
                lVar40 = lStackY_258 + uVar13;
                lVar51 = 0;
                do {
                  pcVar39 = (char *)(uVar13 + lVar51);
                  MIR_insn_op_mode(pgVar37->ctx,pMVar20,(size_t)pcVar39,&iStackY_27c);
                  uVar41 = uStackY_278;
                  pMVar52 = pMStackY_270;
                  if ((iStackY_27c != 0) && (*pcVar47 != '\v')) {
                    if (*pcVar47 != '\x02') {
                      __assert_fail("op_ref->mode == MIR_OP_VAR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x4ff,
                                    "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                                   );
                    }
                    uVar13 = uVar13 + 1 + lVar51;
                    bVar57 = false;
                    goto LAB_001567f5;
                  }
                  lVar51 = lVar51 + 1;
                  pcVar47 = pcVar47 + 0x30;
                } while (lVar40 + lVar51 != 0);
                pcVar39 = (char *)(ulong)(uint)((int)uVar13 + -1 + (int)lVar51);
                uVar13 = uVar13 + lVar51;
                bVar57 = true;
              }
LAB_001567f5:
              if (bVar57) goto LAB_00156827;
              __ptr = pMVar52[(int)pcVar39].data;
              while (__ptr != (void *)0x0) {
                pvVar8 = *(void **)((long)__ptr + 0x20);
                free(__ptr);
                __ptr = pvVar8;
              }
            } while( true );
          }
          pbVar53 = (pbStackY_268->bb_link).next;
          pbVar26 = pbStackY_268;
        } while( true );
      }
      bb = *(gen_ctx **)(uVar13 + uVar41 * 8);
      if (bb != (gen_ctx *)0x0) {
        pgStackY_220 = (gen_ctx *)0x1566a5;
        fprintf((FILE *)pgVar17->debug_file,"  %-5lu",(ulong)*(uint *)&bb->field_0xc);
        pgStackY_220 = (gen_ctx *)0x1566b5;
        pgVar37 = pgVar17;
        print_bb_insn(pgVar17,(bb_insn_t_conflict)bb,1);
        uVar13 = extraout_RAX_00;
      }
      uVar41 = uVar41 + 1;
    } while (extraout_RDX != (ulong *)0x0);
  }
  pgStackY_220 = (gen_ctx *)0x1566c2;
  print_varr_insns_cold_2();
  return extraout_EAX;
}

Assistant:

static int clone_bbs (gen_ctx_t gen_ctx) {
  const int max_bb_growth_factor = 3;
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t dst_insn, last_dst_insn, new_insn, label, next_insn, after;
  bb_t bb, dst, new_bb;
  edge_t e;
  bb_insn_t bb_insn, dst_bb_insn, next_bb_insn;
  MIR_func_t func = curr_func_item->u.func;
  size_t size, orig_size, len, last_orig_bound;
  int res;

  gen_assert (optimize_level != 0);
  bitmap_clear (temp_bitmap);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_set_bit_p (temp_bitmap, bb->index);
    if ((bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns)) == NULL) continue;
    if (bb_insn->insn->code == MIR_RET || bb_insn->insn->code == MIR_JRET) break;
  }
  if (bb == NULL) return FALSE;
  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_NEXT (bb_t, bb); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL);
    if (bb_insn->insn->code == MIR_JMP && (e = DLIST_HEAD (out_edge_t, bb->out_edges)) != NULL
        && bitmap_bit_p (temp_bitmap, e->dst->index))
      VARR_PUSH (bb_t, worklist, bb);
  }
  res = FALSE;
  last_orig_bound = VARR_LENGTH (bb_t, worklist);
  orig_size = size = 0;
  while ((len = VARR_LENGTH (bb_t, worklist)) != 0) {
    if (last_orig_bound > len) {
      last_orig_bound = len;
      orig_size = size = DLIST_LENGTH (bb_insn_t, VARR_LAST (bb_t, worklist)->bb_insns);
    }
    bb = VARR_POP (bb_t, worklist);
    e = DLIST_HEAD (out_edge_t, bb->out_edges);
    gen_assert (DLIST_NEXT (out_edge_t, e) == NULL);
    if (e->back_edge_p) continue;
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL && bb_insn->insn->code == MIR_JMP);
    dst = e->dst;
    dst_bb_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns);
    if (dst_bb_insn->insn->code == MIR_RET || dst_bb_insn->insn->code == MIR_JRET
        || dst_bb_insn->insn->code == MIR_SWITCH || size > max_bb_growth_factor * orig_size)
      continue;
    res = TRUE;
    DEBUG (2, {
      fprintf (debug_file, "  Cloning from BB%lu into BB%lu:\n", (unsigned long) dst->index,
               (unsigned long) bb->index);
    });
    last_dst_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns)->insn;
    after = DLIST_PREV (MIR_insn_t, bb_insn->insn);
    gen_delete_insn (gen_ctx, bb_insn->insn);
    bb_insn = NULL;
    for (dst_bb_insn = DLIST_HEAD (bb_insn_t, dst->bb_insns); dst_bb_insn != NULL;
         dst_bb_insn = DLIST_NEXT (bb_insn_t, dst_bb_insn)) {
      dst_insn = dst_bb_insn->insn;
      if (dst_insn->code == MIR_LABEL) continue;
      new_insn = MIR_copy_insn (ctx, dst_insn);
      /* we can not use gen_add_insn_xxx becuase of some cases (e.g. bb_insn is the last insn): */
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      after = new_insn;
      DEBUG (2, {
        fprintf (debug_file, "  Adding insn %-5lu",
                 (unsigned long) ((bb_insn_t) new_insn->data)->index);
        MIR_output_insn (ctx, debug_file, new_insn, func, TRUE);
      });
      size++;
    }
    delete_edge (e);
    gen_assert (last_dst_insn != NULL);
    if (last_dst_insn->code == MIR_JMP) {
      label = last_dst_insn->ops[0].u.label;
      create_edge (gen_ctx, bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->index))
        VARR_PUSH (bb_t, worklist, bb);
    } else if (!MIR_branch_code_p (last_dst_insn->code)) {
      next_insn = DLIST_NEXT (MIR_insn_t, last_dst_insn);
      next_bb_insn = next_insn->data;
      gen_assert (next_insn->code == MIR_LABEL);
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, next_insn));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      if (bitmap_bit_p (temp_bitmap, next_bb_insn->index)) VARR_PUSH (bb_t, worklist, bb);
      create_edge (gen_ctx, bb, ((bb_insn_t) next_insn->data)->bb, FALSE, TRUE);
    } else {
      label = get_insn_label (gen_ctx, DLIST_NEXT (MIR_insn_t, last_dst_insn)); /* fallthrough */
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, label));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      new_bb = create_bb (gen_ctx, new_insn);
      insert_new_bb_after (gen_ctx, bb, new_bb);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->bb->index))
        VARR_PUSH (bb_t, worklist, new_bb);
      create_edge (gen_ctx, bb, new_bb, TRUE, TRUE); /* fall through */
      create_edge (gen_ctx, bb, ((bb_insn_t) last_dst_insn->ops[0].u.label->data)->bb, FALSE,
                   TRUE); /* branch */
      create_edge (gen_ctx, new_bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
    }
    DEBUG (2, {
      fprintf (debug_file, "  Result BB%lu:\n", (unsigned long) bb->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        MIR_output_insn (ctx, debug_file, bb_insn->insn, func, TRUE);
      }
    });
  }
  if (res) {
    remove_unreachable_bbs (gen_ctx);
    enumerate_bbs (gen_ctx);
  }
  return res;
}